

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result wabt::ValidateScript(Script *script,Errors *errors,ValidateOptions *options)

{
  Result RVar1;
  undefined1 local_48 [8];
  ScriptValidator validator;
  ValidateOptions *options_local;
  Errors *errors_local;
  Script *script_local;
  
  validator._24_8_ = options;
  anon_unknown_4::ScriptValidator::ScriptValidator
            ((ScriptValidator *)local_48,errors,script,options);
  RVar1 = anon_unknown_4::ScriptValidator::CheckScript((ScriptValidator *)local_48);
  return (Result)RVar1.enum_;
}

Assistant:

Result ValidateScript(const Script* script,
                      Errors* errors,
                      const ValidateOptions& options) {
  ScriptValidator validator(errors, script, options);

  return validator.CheckScript();
}